

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void expand_suite::expand_empty(void)

{
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  size_type local_78;
  undefined4 local_6c;
  type local_68 [6];
  circular_view<int,_18446744073709551615UL> local_50;
  
  local_50.member.data = local_68;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 4;
  local_78 = 0;
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xad3,"void expand_suite::expand_empty()",&local_78,&local_6c);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_50,1);
  local_78 = local_50.member.size;
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xad5,"void expand_suite::expand_empty()",&local_78,&local_6c);
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_50,1);
  local_78 = local_50.member.size;
  local_6c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xad7,"void expand_suite::expand_empty()",&local_78,&local_6c);
  return;
}

Assistant:

void expand_empty()
{
    int array[4] = {};
    circular_view<int> span(array);
    BOOST_TEST_EQ(span.size(), 0);
    span.expand_back(1);
    BOOST_TEST_EQ(span.size(), 1);
    span.expand_front(1);
    BOOST_TEST_EQ(span.size(), 2);
}